

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

Client __thiscall
capnp::_::anon_unknown_0::getPersistentCap
          (anon_unknown_0 *this,RpcSystem<capnp::rpc::twoparty::VatId> *client,Side side,Tag tag)

{
  StructDataBitCount *this_00;
  Reader hostId_00;
  Reader objectId;
  ClientHook *extraout_RDX;
  Client CVar1;
  Builder local_2c8;
  Reader local_2b0;
  Reader local_290;
  Builder local_260;
  undefined1 local_238 [8];
  MallocMessageBuilder objectIdMessage;
  undefined1 local_138 [8];
  Builder hostId;
  MallocMessageBuilder hostIdMessage;
  Tag tag_local;
  Side side_local;
  RpcSystem<capnp::rpc::twoparty::VatId> *client_local;
  
  this_00 = &hostId._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)this_00,8,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::rpc::twoparty::VatId>
            ((Builder *)local_138,(MessageBuilder *)this_00);
  rpc::twoparty::VatId::Builder::setSide((Builder *)local_138,side);
  MallocMessageBuilder::MallocMessageBuilder((MallocMessageBuilder *)local_238,8,GROW_HEURISTICALLY)
  ;
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestSturdyRefObjectId>
            (&local_260,(MessageBuilder *)local_238);
  capnproto_test::capnp::test::TestSturdyRefObjectId::Builder::setTag(&local_260,tag);
  rpc::twoparty::VatId::Builder::operator_cast_to_Reader(&local_290,(Builder *)local_138);
  MessageBuilder::getRoot<capnp::AnyPointer>(&local_2c8,(MessageBuilder *)local_238);
  AnyPointer::Builder::operator_cast_to_Reader(&local_2b0,&local_2c8);
  hostId_00._reader.capTable = local_290._reader.capTable;
  hostId_00._reader.segment = local_290._reader.segment;
  hostId_00._reader.data = local_290._reader.data;
  hostId_00._reader.pointers = local_290._reader.pointers;
  hostId_00._reader.dataSize = local_290._reader.dataSize;
  hostId_00._reader.pointerCount = local_290._reader.pointerCount;
  hostId_00._reader._38_2_ = local_290._reader._38_2_;
  hostId_00._reader.nestingLimit = local_290._reader.nestingLimit;
  hostId_00._reader._44_4_ = local_290._reader._44_4_;
  objectId.reader.capTable = local_2b0.reader.capTable;
  objectId.reader.segment = local_2b0.reader.segment;
  objectId.reader.pointer = local_2b0.reader.pointer;
  objectId.reader.nestingLimit = local_2b0.reader.nestingLimit;
  objectId.reader._28_4_ = local_2b0.reader._28_4_;
  RpcSystem<capnp::rpc::twoparty::VatId>::restore
            ((RpcSystem<capnp::rpc::twoparty::VatId> *)this,hostId_00,objectId);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_238);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&hostId._builder.dataSize);
  CVar1.hook.ptr = extraout_RDX;
  CVar1.hook.disposer = (Disposer *)this;
  return (Client)CVar1.hook;
}

Assistant:

Capability::Client getPersistentCap(RpcSystem<rpc::twoparty::VatId>& client,
                                    rpc::twoparty::Side side,
                                    test::TestSturdyRefObjectId::Tag tag) {
  // Create the VatId.
  MallocMessageBuilder hostIdMessage(8);
  auto hostId = hostIdMessage.initRoot<rpc::twoparty::VatId>();
  hostId.setSide(side);

  // Create the SturdyRefObjectId.
  MallocMessageBuilder objectIdMessage(8);
  objectIdMessage.initRoot<test::TestSturdyRefObjectId>().setTag(tag);

  // Connect to the remote capability.
  return client.restore(hostId, objectIdMessage.getRoot<AnyPointer>());
}